

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::LeafPattern::LeafPattern(LeafPattern *this,string *name,value *v)

{
  value *v_local;
  string *name_local;
  LeafPattern *this_local;
  
  Pattern::Pattern(&this->super_Pattern);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR_flat_00333280;
  std::__cxx11::string::string((string *)&this->fName,(string *)name);
  docopt::value::value(&this->fValue,v);
  return;
}

Assistant:

LeafPattern(std::string name, value v = {})
		: fName(std::move(name)),
		  fValue(std::move(v))
		{}